

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

size_t __thiscall
trieste::wf::Choice::expected_distance_to_terminal
          (Choice *this,
          set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *omit,
          size_t max_distance,function<unsigned_long_(trieste::Token)> *distance)

{
  anon_class_24_3_b22afc75 __binary_op;
  unsigned_long uVar1;
  size_t local_10;
  
  __binary_op.max_distance = &local_10;
  __binary_op.omit = omit;
  __binary_op.distance = distance;
  local_10 = max_distance;
  uVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<trieste::Token_const*,std::vector<trieste::Token,std::allocator<trieste::Token>>>,unsigned_long,trieste::wf::Choice::expected_distance_to_terminal(std::set<trieste::Token,std::less<trieste::Token>,std::allocator<trieste::Token>>const&,unsigned_long,std::function<unsigned_long(trieste::Token)>)const::_lambda(unsigned_long,auto:1&)_1_>
                    ((this->types).
                     super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->types).
                     super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish,0,__binary_op);
  return uVar1 / (ulong)((long)(this->types).
                               super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->types).
                               super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3);
}

Assistant:

std::size_t expected_distance_to_terminal(
        const std::set<Token>& omit,
        std::size_t max_distance,
        std::function<std::size_t(Token)> distance) const
      {
        return std::accumulate(
                 types.begin(),
                 types.end(),
                 static_cast<std::size_t>(0),
                 [&](std::size_t acc, auto& type) {
                   if (omit.find(type) != omit.end())
                   {
                     return acc + max_distance;
                   }

                   return acc + distance(type);
                 }) /
          types.size();
      }